

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  LogMessage *other;
  uint uVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField",
               "Field is repeated; the method requires a singular field.");
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar2 = this->extensions_offset_;
    if (iVar2 == -1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4ae);
      other = LogMessage::operator<<(&local_58,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_59,other);
      LogMessage::~LogMessage(&local_58);
      iVar2 = this->extensions_offset_;
    }
    bVar1 = ExtensionSet::Has((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar2),
                              *(int *)(field + 0x28));
  }
  else {
    uVar3 = (int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
            -0x11111111;
    uVar4 = uVar3 + 0x1f;
    if (-1 < (int)uVar3) {
      uVar4 = uVar3;
    }
    bVar1 = (*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (long)((int)uVar4 >> 5) * 4 + (long)this->has_bits_offset_) >> (uVar3 & 0x1f)
            & 1) != 0;
  }
  return bVar1;
}

Assistant:

bool GeneratedMessageReflection::HasField(const Message& message,
                                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    return HasBit(message, field);
  }
}